

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

int compare_attr_p_by_val(attr_p a1,attr_p a2)

{
  char *__s1;
  char *__s2;
  int iVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = 1;
  if (a1 == a2) {
    return 1;
  }
  if (a1->val_type != a2->val_type) {
    return 0;
  }
  switch(a1->val_type) {
  case Attr_Int4:
  case Attr_Int8:
    bVar3 = (a1->value).u.l == (a2->value).u.l;
    break;
  case Attr_String:
    __s1 = (char *)(a1->value).u.p;
    if ((*__s1 == '*') && (__s1[1] == '\0')) {
      return 1;
    }
    __s2 = (char *)(a2->value).u.p;
    if ((*__s2 == '*') && (__s2[1] == '\0')) {
      return 1;
    }
    iVar1 = strcmp(__s1,__s2);
    goto LAB_001059e2;
  case Attr_Opaque:
    iVar1 = (a1->value).u.i;
    if (iVar1 != (a2->value).u.i) {
      return 0;
    }
    iVar1 = bcmp((a1->value).u.o.buffer,(a2->value).u.o.buffer,(long)iVar1);
LAB_001059e2:
    bVar3 = iVar1 == 0;
    break;
  case Attr_Atom:
    bVar3 = (a1->value).u.i == (a2->value).u.i;
    break;
  case Attr_List:
    iVar1 = attr_list_subset((attr_list)(a1->value).u.p,(attr_list)(a2->value).u.p);
    return iVar1;
  default:
    goto switchD_00105990_default;
  }
  uVar2 = (uint)bVar3;
switchD_00105990_default:
  return uVar2;
}

Assistant:

extern
int
compare_attr_p_by_val (attr_p a1, attr_p a2)
{
  int eq = 0;
  
  if (a1 == a2)
    return 1;

  if (a1->val_type == a2->val_type)
    {
      if (a1->val_type == Attr_Int4 ||
	  a1->val_type == Attr_Int8)
	{
	  eq = ATTR_INT4_8_EQ(a1,a2);
	}
      else if (a1->val_type == Attr_String)
	{
	  eq = ATTR_STRING_EQ(a1,a2);
	}
      else if (a1->val_type == Attr_Opaque)
	{
	  eq = ATTR_OPAQUE_EQ(a1,a2);
	}
      else if (a1->val_type == Attr_Atom)
	{
	  eq = ATTR_ATOM_EQ(a1,a2);
	}
      else if (a1->val_type == Attr_List)
	{
	  eq = attr_list_subset ((attr_list)a1->value.u.p,
				 (attr_list)a2->value.u.p);
	}
      else
	{
	  eq = 1;
	}

    }
  
  return eq;
}